

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::AdvancedUsageSwitchPrograms::Run(AdvancedUsageSwitchPrograms *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  void *__s;
  GLuint *ebo;
  int offset;
  int binding;
  long lVar2;
  ulong uVar3;
  int offset_00;
  value_type_conflict4 *__val;
  long offset_01;
  bool bVar4;
  GLint p3;
  GLint p2;
  char *xfb_var;
  string fs_str;
  string vs_str;
  GLint p1;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cc,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,&p2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p3);
  lVar2 = 0;
  if (((7 < p1) && (0 < p2)) && (7 < p3)) {
    offset = 0x80;
    offset_00 = 0;
    binding = 7;
    lVar2 = 0;
    do {
      GenVSSrc_abi_cxx11_(&vs_str,this,(int)lVar2,offset_00);
      GenFSSrc_abi_cxx11_(&fs_str,this,binding,offset);
      program = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                          (&this->super_SACSubcaseBase,vs_str._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,fs_str._M_dataplus._M_p,(char *)0x0,p3._0_1_);
      this->prog_[lVar2] = program;
      xfb_var = "o_atomic_value";
      glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,1,&xfb_var,0x8c8d);
      gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram
                (&this->super_SACSubcaseBase,this->prog_[lVar2]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_str._M_dataplus._M_p != &fs_str.field_2) {
        operator_delete(fs_str._M_dataplus._M_p,fs_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vs_str._M_dataplus._M_p != &vs_str.field_2) {
        operator_delete(vs_str._M_dataplus._M_p,vs_str.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
      offset = offset + 0x10;
      offset_00 = offset_00 + 8;
      binding = binding + -1;
    } while (lVar2 != 8);
    glu::CallLogWrapper::glGenBuffers(this_00,8,this->counter_buffer_);
    lVar2 = 10;
    do {
      __s = operator_new(0x400);
      memset(__s,0,0x400);
      glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_[lVar2 + -10]);
      glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x400,__s,0x88ea);
      operator_delete(__s,0x400);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x12);
    lVar2 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->rt_);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    ebo = (GLuint *)(ulong)this->rt_;
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->rt_,0);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    do {
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x92c0,(GLuint)lVar2,this->counter_buffer_[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    offset_01 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->xfb_buffer_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    bVar4 = true;
    lVar2 = 0x80;
    uVar3 = 0;
    do {
      glu::CallLogWrapper::glUseProgram(this_00,this->prog_[uVar3]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
      glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_[uVar3],offset_01,3);
      if (!bVar1) break;
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_[uVar3 ^ 7],lVar2,0x40);
      if (!bVar1) break;
      bVar4 = uVar3 < 7;
      uVar3 = uVar3 + 1;
      offset_01 = offset_01 + 8;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 != 8);
    lVar2 = -(ulong)bVar4;
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		if (p1 < 8 || p2 < 1 || p3 < 8)
		{
			return NO_ERROR;
		}

		// create programs
		for (int i = 0; i < 8; ++i)
		{
			std::string vs_str  = GenVSSrc(i, i * 8);
			std::string fs_str  = GenFSSrc(7 - i, 128 + i * 16);
			const char* src_vs  = vs_str.c_str();
			const char* src_fs  = fs_str.c_str();
			prog_[i]			= CreateProgram(src_vs, NULL, NULL, NULL, src_fs, false);
			const char* xfb_var = "o_atomic_value";
			glTransformFeedbackVaryings(prog_[i], 1, &xfb_var, GL_SEPARATE_ATTRIBS);
			LinkProgram(prog_[i]);
		}

		// create atomic counter buffers
		glGenBuffers(8, counter_buffer_);
		for (int i = 0; i < 8; ++i)
		{
			std::vector<GLuint> init_data(256);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
						 GL_DYNAMIC_COPY);
		}
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffer
		glGenBuffers(1, &xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render target
		const int s = 8;
		glGenTextures(1, &rt_);
		glBindTexture(GL_TEXTURE_2D, rt_);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_, 0);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		for (GLuint i = 0; i < 8; ++i)
		{
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, counter_buffer_[i]);
		}
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindVertexArray(vao_);

		for (int i = 0; i < 8; ++i)
		{
			glUseProgram(prog_[i]);
			glBeginTransformFeedback(GL_TRIANGLES);
			glDrawArrays(GL_TRIANGLES, 0, 3);
			glEndTransformFeedback();
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

			if (!CheckFinalCounterValue(counter_buffer_[i], i * 8, 3))
				return ERROR;
			if (!CheckFinalCounterValue(counter_buffer_[7 - i], 128 + i * 16, 64))
				return ERROR;
		}
		return NO_ERROR;
	}